

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void wallet::coinselector_tests::add_coin
               (CAmount *nValue,int nInput,SelectionResult *result,CAmount fee,CAmount long_term_fee
               )

{
  CAmount CVar1;
  reference pvVar2;
  element_type *peVar3;
  bool *in_RDX;
  undefined4 in_ESI;
  CAmount *in_RDI;
  CAmount in_R8;
  long in_FS_OFFSET;
  OutputGroup group;
  shared_ptr<wallet::COutput> coin;
  CMutableTransaction tx;
  CMutableTransaction *in_stack_fffffffffffffe68;
  uint32_t nIn;
  OutputGroup *this;
  Txid *in_stack_fffffffffffffe70;
  OutputGroup *group_00;
  COutPoint *in_stack_fffffffffffffe78;
  SelectionResult *this_00;
  size_type in_stack_fffffffffffffe80;
  undefined1 *ancestors;
  CMutableTransaction *in_stack_fffffffffffffe88;
  OutputGroup *this_01;
  OutputGroup *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffed0;
  CTxOut *in_stack_fffffffffffffee0;
  COutPoint *in_stack_fffffffffffffee8;
  bool *in_stack_ffffffffffffff30;
  bool *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  uint7 in_stack_ffffffffffffff48;
  byte in_stack_ffffffffffffff54;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(in_stack_fffffffffffffe68);
  nIn = (uint32_t)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffe88,
             in_stack_fffffffffffffe80);
  CVar1 = *in_RDI;
  pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffe78,
                      (size_type)in_stack_fffffffffffffe70);
  pvVar2->nValue = CVar1;
  nextLockTime = nextLockTime + 1;
  CMutableTransaction::GetHash(in_stack_fffffffffffffe88);
  COutPoint::COutPoint(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,nIn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::at
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffe78,
             (size_type)in_stack_fffffffffffffe70);
  this_01 = (OutputGroup *)&stack0xffffffffffffffa8;
  ancestors = &stack0xffffffffffffff4f;
  this_00 = (SelectionResult *)&stack0xffffffffffffff50;
  group_00 = (OutputGroup *)&stack0xffffffffffffff55;
  this = (OutputGroup *)&stack0xffffffffffffff56;
  std::make_shared<wallet::COutput,COutPoint,CTxOut&,int,int,bool,bool,bool,int,bool,long&>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,(int *)in_RDI,
             (int *)CONCAT44(in_ESI,in_stack_fffffffffffffed0),in_RDX,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
             (bool *)(ulong)in_stack_ffffffffffffff48,
             (long *)CONCAT17(1,CONCAT16(1,CONCAT15(1,(uint5)in_stack_ffffffffffffff54 << 0x20))));
  OutputGroup::OutputGroup(this_01);
  OutputGroup::Insert(in_stack_fffffffffffffe90,(shared_ptr<wallet::COutput> *)this_01,
                      (size_t)ancestors,in_stack_fffffffffffffe98);
  peVar3 = std::__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar3->long_term_fee = in_R8;
  SelectionResult::AddInput(this_00,group_00);
  OutputGroup::~OutputGroup(this);
  std::shared_ptr<wallet::COutput>::~shared_ptr((shared_ptr<wallet::COutput> *)this);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void add_coin(const CAmount& nValue, int nInput, SelectionResult& result, CAmount fee, CAmount long_term_fee)
{
    CMutableTransaction tx;
    tx.vout.resize(nInput + 1);
    tx.vout[nInput].nValue = nValue;
    tx.nLockTime = nextLockTime++;        // so all transactions get different hashes
    std::shared_ptr<COutput> coin = std::make_shared<COutput>(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ 148, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, fee);
    OutputGroup group;
    group.Insert(coin, /*ancestors=*/ 0, /*descendants=*/ 0);
    coin->long_term_fee = long_term_fee; // group.Insert() will modify long_term_fee, so we need to set it afterwards
    result.AddInput(group);
}